

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-randart.c
# Opt level: O0

void add_slay(artifact *art)

{
  _Bool _Var1;
  uint32_t uVar2;
  slay_conflict *psStack_20;
  wchar_t pick;
  slay *slay;
  wchar_t count;
  artifact *art_local;
  
  psStack_20 = (slay_conflict *)0x0;
  slay._4_4_ = 0;
  do {
    if (199 < slay._4_4_) {
LAB_001d557a:
      if (psStack_20 != (slay_conflict *)0x0) {
        uVar2 = Rand_div(4);
        if ((uVar2 != 0) && (psStack_20->power < 0x69)) {
          add_slay(art);
        }
      }
      return;
    }
    uVar2 = Rand_div(z_info->slay_max - 1);
    _Var1 = append_slay(&art->slays,uVar2 + L'\x01');
    if (_Var1) {
      psStack_20 = slays + (uVar2 + L'\x01');
      file_putf(log_file,"Adding slay: %sx%d\n",psStack_20->name,(ulong)(uint)psStack_20->multiplier
               );
      goto LAB_001d557a;
    }
    slay._4_4_ = slay._4_4_ + 1;
  } while( true );
}

Assistant:

static void add_slay(struct artifact *art)
{
	int count;
	struct slay *slay = NULL;

	for (count = 0; count < MAX_TRIES; count++) {
		int pick = randint1(z_info->slay_max - 1);

		if (!append_slay(&art->slays, pick)) continue;
		slay = &slays[pick];
		file_putf(log_file, "Adding slay: %sx%d\n", slay->name,
				  slay->multiplier);
		break;
	}

	/* Frequently add more slays if the first choice is weak */
	if (slay && randint0(4) && (slay->power < 105)) {
		add_slay(art);
	}
}